

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::dup
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,int __fd)

{
  int *piVar1;
  KeyVal *in_RAX;
  KeyVal *p;
  Array<asl::Map<asl::String,_int>::KeyVal> b;
  Array<asl::Map<asl::String,_int>::KeyVal> local_18;
  
  p = this->_a;
  if (p[-1].value != 1) {
    local_18._a = in_RAX;
    Array(&local_18,p,*(int *)((long)&p[-1].key.field_2 + 8));
    if (this->_a != local_18._a) {
      LOCK();
      piVar1 = &this->_a[-1].value;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(this,p);
      }
      this->_a = (KeyVal *)local_18;
      LOCK();
      local_18._a[-1].value = local_18._a[-1].value + 1;
      UNLOCK();
    }
    ~Array(&local_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}